

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O3

void __thiscall
cbtSimulationIslandManager::updateActivationState
          (cbtSimulationIslandManager *this,cbtCollisionWorld *colWorld,cbtDispatcher *dispatcher)

{
  cbtCollisionObject **ppcVar1;
  cbtCollisionObject *pcVar2;
  long lVar3;
  long lVar4;
  cbtDispatcher *pcVar5;
  
  lVar3 = (long)(colWorld->m_collisionObjects).m_size;
  if (lVar3 < 1) {
    pcVar5 = (cbtDispatcher *)0x0;
  }
  else {
    ppcVar1 = (colWorld->m_collisionObjects).m_data;
    lVar4 = 0;
    pcVar5 = (cbtDispatcher *)0x0;
    do {
      pcVar2 = ppcVar1[lVar4];
      if ((pcVar2->m_collisionFlags & 3) == 0) {
        pcVar2->m_islandTag1 = (int)pcVar5;
        pcVar5 = (cbtDispatcher *)(ulong)((int)pcVar5 + 1);
      }
      lVar4 = lVar4 + 1;
      pcVar2->m_companionId = -1;
      pcVar2->m_hitFraction = 1.0;
    } while (lVar3 != lVar4);
  }
  cbtUnionFind::reset(&this->m_unionFind,(int)pcVar5);
  findUnions(this,pcVar5,colWorld);
  return;
}

Assistant:

void cbtSimulationIslandManager::updateActivationState(cbtCollisionWorld* colWorld, cbtDispatcher* dispatcher)
{
	// put the index into m_controllers into m_tag
	int index = 0;
	{
		int i;
		for (i = 0; i < colWorld->getCollisionObjectArray().size(); i++)
		{
			cbtCollisionObject* collisionObject = colWorld->getCollisionObjectArray()[i];
			//Adding filtering here
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag(index++);
			}
			collisionObject->setCompanionId(-1);
			collisionObject->setHitFraction(cbtScalar(1.));
		}
	}
	// do the union find

	initUnionFind(index);

	findUnions(dispatcher, colWorld);
}